

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

AssignmentPatternExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::AssignmentPatternExpressionSyntax,slang::syntax::AssignmentPatternExpressionSyntax_const&>
          (BumpAllocator *this,AssignmentPatternExpressionSyntax *args)

{
  SyntaxNode *pSVar1;
  DataTypeSyntax *pDVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  AssignmentPatternExpressionSyntax *pAVar5;
  
  pAVar5 = (AssignmentPatternExpressionSyntax *)
           ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((AssignmentPatternExpressionSyntax *)this->endPtr < pAVar5 + 1) {
    pAVar5 = (AssignmentPatternExpressionSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pAVar5 + 1);
  }
  (pAVar5->pattern).ptr = (args->pattern).ptr;
  SVar3 = (args->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)
           &(args->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.parent;
  pDVar2 = args->type;
  (pAVar5->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode =
       (args->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode;
  pAVar5->type = pDVar2;
  (pAVar5->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)
   &(pAVar5->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4 =
       uVar4;
  (pAVar5->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = pSVar1;
  return pAVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }